

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiNavLayer in_EDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool in_stack_0000001f;
  ImGuiWindow *in_stack_00000020;
  
  pIVar1 = GImGui;
  if (in_EDI == ImGuiNavLayer_Main) {
    pIVar2 = NavRestoreLastChildNavWindow(GImGui->NavWindow);
    pIVar1->NavWindow = pIVar2;
  }
  pIVar2 = pIVar1->NavWindow;
  if (pIVar2->NavLastIds[in_EDI] == 0) {
    pIVar1->NavLayer = in_EDI;
    NavInitWindow(in_stack_00000020,in_stack_0000001f);
  }
  else {
    SetNavID(pIVar2->NavLastIds[in_EDI],in_EDI,0,pIVar2->NavRectRel + in_EDI);
  }
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}